

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_font_x.cxx
# Opt level: O1

void __thiscall Fl_Font_Descriptor::Fl_Font_Descriptor(Fl_Font_Descriptor *this,char *name)

{
  XUtf8FontStruct *pXVar1;
  
  pXVar1 = XCreateUtf8FontStruct(fl_display,name);
  this->font = pXVar1;
  if (pXVar1 == (XUtf8FontStruct *)0x0) {
    (*Fl::warning)("bad font: %s",name);
    pXVar1 = XCreateUtf8FontStruct(fl_display,"fixed");
    this->font = pXVar1;
  }
  this->glok[0x2c] = '\0';
  this->glok[0x2d] = '\0';
  this->glok[0x2e] = '\0';
  this->glok[0x2f] = '\0';
  this->glok[0x30] = '\0';
  this->glok[0x31] = '\0';
  this->glok[0x32] = '\0';
  this->glok[0x33] = '\0';
  this->glok[0x34] = '\0';
  this->glok[0x35] = '\0';
  this->glok[0x36] = '\0';
  this->glok[0x37] = '\0';
  this->glok[0x38] = '\0';
  this->glok[0x39] = '\0';
  this->glok[0x3a] = '\0';
  this->glok[0x3b] = '\0';
  this->glok[0x1c] = '\0';
  this->glok[0x1d] = '\0';
  this->glok[0x1e] = '\0';
  this->glok[0x1f] = '\0';
  this->glok[0x20] = '\0';
  this->glok[0x21] = '\0';
  this->glok[0x22] = '\0';
  this->glok[0x23] = '\0';
  this->glok[0x24] = '\0';
  this->glok[0x25] = '\0';
  this->glok[0x26] = '\0';
  this->glok[0x27] = '\0';
  this->glok[0x28] = '\0';
  this->glok[0x29] = '\0';
  this->glok[0x2a] = '\0';
  this->glok[0x2b] = '\0';
  this->glok[0xc] = '\0';
  this->glok[0xd] = '\0';
  this->glok[0xe] = '\0';
  this->glok[0xf] = '\0';
  this->glok[0x10] = '\0';
  this->glok[0x11] = '\0';
  this->glok[0x12] = '\0';
  this->glok[0x13] = '\0';
  this->glok[0x14] = '\0';
  this->glok[0x15] = '\0';
  this->glok[0x16] = '\0';
  this->glok[0x17] = '\0';
  this->glok[0x18] = '\0';
  this->glok[0x19] = '\0';
  this->glok[0x1a] = '\0';
  this->glok[0x1b] = '\0';
  this->listbase = 0;
  this->glok[0] = '\0';
  this->glok[1] = '\0';
  this->glok[2] = '\0';
  this->glok[3] = '\0';
  this->glok[4] = '\0';
  this->glok[5] = '\0';
  this->glok[6] = '\0';
  this->glok[7] = '\0';
  this->glok[8] = '\0';
  this->glok[9] = '\0';
  this->glok[10] = '\0';
  this->glok[0xb] = '\0';
  this->glok[0x3c] = '\0';
  this->glok[0x3d] = '\0';
  this->glok[0x3e] = '\0';
  this->glok[0x3f] = '\0';
  return;
}

Assistant:

Fl_Font_Descriptor::Fl_Font_Descriptor(const char* name) {
  font = XCreateUtf8FontStruct(fl_display, name);
  if (!font) {
    Fl::warning("bad font: %s", name);
    font = XCreateUtf8FontStruct(fl_display, "fixed");
  }
#  if HAVE_GL
  listbase = 0;
  for (int u = 0; u < 64; u++) glok[u] = 0;
#  endif
}